

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O0

void __thiscall GLFlat::DrawSubsector(GLFlat *this,subsector_t *sub)

{
  float fVar1;
  vertex_t *this_00;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  vertex_t *vt_1;
  uint local_60;
  uint x;
  uint j;
  uint i;
  uint vi [4];
  undefined1 local_40 [8];
  FQuadDrawer qd;
  vertex_t *vt;
  FFlatVertex *pFStack_20;
  uint k;
  FFlatVertex *ptr;
  subsector_t *sub_local;
  GLFlat *this_local;
  
  if (gl.buffermethod == 1) {
    FQuadDrawer::FQuadDrawer((FQuadDrawer *)local_40);
    j = 0;
    for (x = 1; x < sub->numlines - 1; x = x + 2) {
      if (x < sub->numlines - 3) {
        for (local_60 = 1; local_60 < 4; local_60 = local_60 + 1) {
          uVar2 = MIN<unsigned_int>(x + local_60,sub->numlines - 1);
          (&j)[local_60] = uVar2;
        }
        for (vt_1._4_4_ = 0; vt_1._4_4_ < 4; vt_1._4_4_ = vt_1._4_4_ + 1) {
          this_00 = sub->firstline[(&j)[vt_1._4_4_]].v1;
          dVar3 = vertex_t::fX(this_00);
          dVar4 = secplane_t::ZatPoint(&(this->plane).plane,this_00);
          fVar1 = this->dz;
          dVar5 = vertex_t::fY(this_00);
          dVar6 = vertex_t::fX(this_00);
          dVar7 = vertex_t::fY(this_00);
          FQuadDrawer::Set((FQuadDrawer *)local_40,vt_1._4_4_,(float)dVar3,
                           (float)(dVar4 + (double)fVar1),(float)dVar5,(float)(dVar6 / 64.0),
                           (float)(-dVar7 / 64.0));
        }
        FQuadDrawer::Render((FQuadDrawer *)local_40,6);
      }
    }
  }
  else {
    pFStack_20 = FFlatVertexBuffer::GetBuffer(GLRenderer->mVBO);
    for (vt._4_4_ = 0; vt._4_4_ < sub->numlines; vt._4_4_ = vt._4_4_ + 1) {
      qd._8_8_ = sub->firstline[vt._4_4_].v1;
      dVar3 = vertex_t::fX((vertex_t *)qd._8_8_);
      pFStack_20->x = (float)dVar3;
      dVar3 = secplane_t::ZatPoint(&(this->plane).plane,(vertex_t *)qd._8_8_);
      pFStack_20->z = (float)(dVar3 + (double)this->dz);
      dVar3 = vertex_t::fY((vertex_t *)qd._8_8_);
      pFStack_20->y = (float)dVar3;
      dVar3 = vertex_t::fX((vertex_t *)qd._8_8_);
      pFStack_20->u = (float)(dVar3 / 64.0);
      dVar3 = vertex_t::fY((vertex_t *)qd._8_8_);
      pFStack_20->v = (float)(-dVar3 / 64.0);
      pFStack_20 = pFStack_20 + 1;
    }
    FFlatVertexBuffer::RenderCurrent(GLRenderer->mVBO,pFStack_20,6,(uint *)0x0,(uint *)0x0);
  }
  flatvertices = sub->numlines + flatvertices;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSubsector(subsector_t * sub)
{
	if (gl.buffermethod != BM_DEFERRED)
	{
		FFlatVertex *ptr = GLRenderer->mVBO->GetBuffer();
		for (unsigned int k = 0; k < sub->numlines; k++)
		{
			vertex_t *vt = sub->firstline[k].v1;
			ptr->x = vt->fX();
			ptr->z = plane.plane.ZatPoint(vt) + dz;
			ptr->y = vt->fY();
			ptr->u = vt->fX() / 64.f;
			ptr->v = -vt->fY() / 64.f;
			ptr++;
		}
		GLRenderer->mVBO->RenderCurrent(ptr, GL_TRIANGLE_FAN);
	}
	else
	{
		// if we cannot access the buffer, use the quad drawer as fallback by splitting the subsector into quads.
		// Trying to get this into the vertex buffer in the processing pass is too costly and this is only used for render hacks.
		FQuadDrawer qd;
		unsigned int vi[4];

		vi[0] = 0;
		for (unsigned int i = 1; i < sub->numlines-1; i += 2)
		{
			if (i < sub->numlines - 3)
			{
				for (unsigned int j = 1; j < 4; j++)
				{
					vi[j] = MIN(i + j, sub->numlines - 1);
				}
				for (unsigned int x = 0; x < 4; x++)
				{
					vertex_t *vt = sub->firstline[vi[x]].v1;
					qd.Set(x, vt->fX(), plane.plane.ZatPoint(vt) + dz, vt->fY(), vt->fX() / 64.f, -vt->fY() / 64.f);
				}
				qd.Render(GL_TRIANGLE_FAN);
			}
		}
	}

	flatvertices += sub->numlines;
	flatprimitives++;
}